

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_store_statement
          (CompilerGLSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  bool bVar1;
  ulong uVar2;
  SPIRType *pSVar3;
  ID local_6c;
  undefined1 local_68 [8];
  string lhs;
  undefined1 local_38 [8];
  string rhs;
  uint32_t rhs_expression_local;
  uint32_t lhs_expression_local;
  CompilerGLSL *this_local;
  
  to_pointer_expression_abi_cxx11_((CompilerGLSL *)local_38,(uint32_t)this,SUB41(rhs_expression,0));
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    handle_store_to_invariant_variable(this,lhs_expression,rhs_expression);
    bVar1 = unroll_array_to_complex_store(this,lhs_expression,rhs_expression);
    if (!bVar1) {
      to_dereferenced_expression_abi_cxx11_
                ((CompilerGLSL *)local_68,(uint32_t)this,SUB41(lhs_expression,0));
      TypedID<(spirv_cross::Types)0>::TypedID(&local_6c,lhs_expression);
      bVar1 = Compiler::has_decoration(&this->super_Compiler,local_6c,DecorationNonUniform);
      if (bVar1) {
        convert_non_uniform_expression(this,(string *)local_68,lhs_expression);
      }
      pSVar3 = Compiler::expression_type(&this->super_Compiler,rhs_expression);
      (*(this->super_Compiler)._vptr_Compiler[0x3c])(this,(ulong)lhs_expression,local_38,pSVar3);
      pSVar3 = Compiler::expression_type(&this->super_Compiler,rhs_expression);
      bVar1 = optimize_read_modify_write(this,pSVar3,(string *)local_68,(string *)local_38);
      if (!bVar1) {
        statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_68,(char (*) [4])0x5cb349,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   (char (*) [2])0x5b3b6f);
      }
      ::std::__cxx11::string::~string((string *)local_68);
    }
    Compiler::register_write(&this->super_Compiler,lhs_expression);
  }
  ::std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void CompilerGLSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto rhs = to_pointer_expression(rhs_expression);

	// Statements to OpStore may be empty if it is a struct with zero members. Just forward the store to /dev/null.
	if (!rhs.empty())
	{
		handle_store_to_invariant_variable(lhs_expression, rhs_expression);

		if (!unroll_array_to_complex_store(lhs_expression, rhs_expression))
		{
			auto lhs = to_dereferenced_expression(lhs_expression);
			if (has_decoration(lhs_expression, DecorationNonUniform))
				convert_non_uniform_expression(lhs, lhs_expression);

			// We might need to cast in order to store to a builtin.
			cast_to_variable_store(lhs_expression, rhs, expression_type(rhs_expression));

			// Tries to optimize assignments like "<lhs> = <lhs> op expr".
			// While this is purely cosmetic, this is important for legacy ESSL where loop
			// variable increments must be in either i++ or i += const-expr.
			// Without this, we end up with i = i + 1, which is correct GLSL, but not correct GLES 2.0.
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		register_write(lhs_expression);
	}
}